

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_MissileAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  PClass *pPVar2;
  PClassActor *MissileType;
  AActor *self;
  char *__assertion;
  FSoundID local_20;
  FName local_1c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003d92d8;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d92d8;
        }
        goto LAB_003d9271;
      }
    }
    else if (self != (AActor *)0x0) goto LAB_003d92c8;
    self = (AActor *)0x0;
LAB_003d9271:
    pPVar2 = DObject::GetClass((DObject *)self);
    local_1c.Index = *(int *)((long)&pPVar2[1].ParentClass + 4);
    MissileType = PClass::FindActor(&local_1c);
    local_20.ID = 0;
    pPVar2 = DObject::GetClass((DObject *)self);
    DoAttack(self,false,true,0,&local_20,MissileType,(double)pPVar2[1].Pointers);
    return 0;
  }
LAB_003d92c8:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003d92d8:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x3cb,
                "int AF_AActor_A_MissileAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MissileAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PClassActor *MissileType = PClass::FindActor(self->GetClass()->MissileName);
	DoAttack(self, false, true, 0, 0, MissileType, self->GetClass()->MissileHeight);
	return 0;
}